

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

void __thiscall
tchecker::algorithms::couvscc::
single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::close_scc
          (single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t> *this
          ,node_sptr_t *n)

{
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  iVar1;
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
  *pmVar2;
  long lVar3;
  bool *pbVar4;
  underflow_error *this_00;
  _Elt_pointer piVar5;
  code *pcVar6;
  undefined *puVar7;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  local_30;
  
  std::
  deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
  ::pop_back(&(this->_roots).c);
  local_30._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                 *)0x0;
  do {
    piVar5 = (this->_active).c.
             super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (piVar5 == (this->_active).c.
                  super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      piVar5 = (this->_active).c.
               super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    iVar1._t = local_30._t;
    if (&local_30 != piVar5 + -1) {
      iVar1._t = piVar5[-1]._t;
      if (((node_t *)iVar1._t != (node_t *)0x0) &&
         (lVar3 = *(long *)&((node_t *)((long)iVar1._t + -0xc))->_dfsnum + 1,
         *(long *)&((node_t *)((long)iVar1._t + -0xc))->_dfsnum = lVar3, lVar3 == -2)) {
        this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error((overflow_error *)this_00,"reference counter overflow");
        pcVar6 = std::overflow_error::~overflow_error;
        puVar7 = &std::overflow_error::typeinfo;
LAB_0012d751:
        __cxa_throw(this_00,puVar7,pcVar6);
      }
      if ((node_t *)local_30._t != (node_t *)0x0) {
        pmVar2 = (((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                    *)((long)(local_30._t + -1) + 0x20))->_head)._t;
        if (pmVar2 == (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                       *)0x0) {
          this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
          std::underflow_error::underflow_error(this_00,"reference counter underflow");
          pcVar6 = std::underflow_error::~underflow_error;
          puVar7 = &std::underflow_error::typeinfo;
          goto LAB_0012d751;
        }
        (((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
           *)((long)(local_30._t + -1) + 0x20))->_head)._t =
             (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
              *)((long)&pmVar2[-1].
                        super_edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
                        .
                        super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                        .
                        super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                        ._node._t + 7);
      }
    }
    local_30._t = iVar1._t;
    std::
    deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
    ::pop_back(&(this->_active).c);
    if ((node_t *)local_30._t == (node_t *)0x0) {
      __assert_fail("_t != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                    ,0x1db,
                    "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>]"
                   );
    }
    pbVar4 = couvscc::node_t::current((node_t *)local_30._t);
    *pbVar4 = false;
    if ((node_t *)local_30._t == (node_t *)n->_t) {
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_30);
      return;
    }
  } while( true );
}

Assistant:

void close_scc(node_sptr_t & n)
  {
    _roots.pop();

    node_sptr_t u{nullptr};
    do {
      u = _active.top();
      _active.pop();
      u->current() = false;
    } while (u != n);
  }